

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.cpp
# Opt level: O0

vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> * __thiscall
myvk::BufferBase::GetSrcMemoryBarriers
          (BufferBase *this,vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *regions,
          VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask,uint32_t src_queue_family,
          uint32_t dst_queue_family)

{
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *this_00;
  size_type sVar1;
  reference pvVar2;
  const_reference pvVar3;
  VkAccessFlags in_ECX;
  vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *in_RDX;
  allocator_type *in_RSI;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *in_RDI;
  VkAccessFlags in_R8D;
  uint32_t in_R9D;
  uint32_t in_stack_00000008;
  VkBufferMemoryBarrier *cur;
  uint32_t i;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *barriers;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *this_01;
  uint local_38;
  allocator<VkBufferMemoryBarrier> local_26;
  undefined1 local_25;
  uint32_t local_24;
  VkAccessFlags local_20;
  VkAccessFlags local_1c;
  vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *local_18;
  
  local_25 = 0;
  this_01 = in_RDI;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  this_00 = (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
            std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::size(in_RDX);
  std::allocator<VkBufferMemoryBarrier>::allocator((allocator<VkBufferMemoryBarrier> *)0x2a97a2);
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            (this_00,(size_type)this_01,in_RSI);
  std::allocator<VkBufferMemoryBarrier>::~allocator(&local_26);
  for (local_38 = 0;
      sVar1 = std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::size(local_18),
      local_38 < sVar1; local_38 = local_38 + 1) {
    pvVar2 = std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::operator[]
                       (this_01,(ulong)local_38);
    pvVar2->sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
    pvVar3 = std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::operator[]
                       (local_18,(ulong)local_38);
    pvVar2->size = pvVar3->size;
    pvVar2->buffer = *(VkBuffer *)(in_RSI + 0x18);
    pvVar3 = std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::operator[]
                       (local_18,(ulong)local_38);
    pvVar2->offset = pvVar3->srcOffset;
    pvVar2->srcAccessMask = local_1c;
    pvVar2->dstAccessMask = local_20;
    pvVar2->srcQueueFamilyIndex = local_24;
    pvVar2->dstQueueFamilyIndex = in_stack_00000008;
  }
  return in_RDI;
}

Assistant:

std::vector<VkBufferMemoryBarrier> BufferBase::GetSrcMemoryBarriers(const std::vector<VkBufferCopy> &regions,
                                                                    VkAccessFlags src_access_mask,
                                                                    VkAccessFlags dst_access_mask,
                                                                    uint32_t src_queue_family,
                                                                    uint32_t dst_queue_family) const {
	std::vector<VkBufferMemoryBarrier> barriers(regions.size());
	for (uint32_t i = 0; i < regions.size(); ++i) {
		VkBufferMemoryBarrier &cur = barriers[i];
		cur.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
		cur.size = regions[i].size;

		cur.buffer = m_buffer;
		cur.offset = regions[i].srcOffset;
		cur.srcAccessMask = src_access_mask;
		cur.dstAccessMask = dst_access_mask;
		cur.srcQueueFamilyIndex = src_queue_family;
		cur.dstQueueFamilyIndex = dst_queue_family;
	}
	return barriers;
}